

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdUtils.cpp
# Opt level: O1

uint32 Js::SIMDUtils::SimdOpcodeAsIndex(OpCode op)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  undefined6 in_register_0000003a;
  
  uVar3 = (uint)CONCAT62(in_register_0000003a,op);
  if (uVar3 < 0x2af) {
    uVar3 = uVar3 - 0x299 & 0xffff;
  }
  else {
    if (Simd128_End_Extend < op) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SimdUtils.cpp"
                                  ,0x77,
                                  "(op >= Js::OpCode::Simd128_Start_Extend && op <= Js::OpCode::Simd128_End_Extend)"
                                  ,
                                  "op >= Js::OpCode::Simd128_Start_Extend && op <= Js::OpCode::Simd128_End_Extend"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    uVar3 = (uVar3 - 0x2af & 0xffff) + 0x16;
  }
  return uVar3;
}

Assistant:

uint32 SIMDUtils::SimdOpcodeAsIndex(Js::OpCode op)
    {
        if (op <= Js::OpCode::Simd128_End)
        {
            return (uint32)((Js::OpCode)op - Js::OpCode::Simd128_Start);
        }
        else
        {
            Assert(op >= Js::OpCode::Simd128_Start_Extend && op <= Js::OpCode::Simd128_End_Extend);
            return (uint32)((Js::OpCode)op - Js::OpCode::Simd128_Start_Extend) + (uint32)(Js::OpCode::Simd128_End - Js::OpCode::Simd128_Start) + 1;
        }
    }